

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++:67:43)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_test_c__:67:43)>
          *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar2;
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> depResult;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_3c8;
  Maybe<capnp::MessageReaderAndFds> local_3c0;
  ExceptionOr<kj::Promise<void>_> local_398;
  ExceptionOrValue local_1f0;
  char local_58;
  Maybe<capnp::MessageReaderAndFds> local_50;
  
  local_1f0.exception.ptr.isSet = false;
  local_58 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1f0);
  uVar1 = local_1f0.exception.ptr.field_1.value.context.ptr.ptr;
  if (local_1f0.exception.ptr.isSet == true) {
    local_398.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_1f0.exception.ptr.field_1.value.ownFile.content.ptr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_1f0.exception.ptr.field_1.value.ownFile.content.size_;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_1f0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_1f0.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1f0.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_1f0.exception.ptr.field_1.value.file;
    local_398.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_1f0.exception.ptr.field_1._32_8_;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_1f0.exception.ptr.field_1.value.description.content.ptr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_1f0.exception.ptr.field_1.value.description.content.size_;
    local_1f0.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1f0.exception.ptr.field_1.value.description.content.size_ = 0;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_1f0.exception.ptr.field_1.value.description.content.disposer;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_1f0.exception.ptr.field_1.value.context.ptr.disposer;
    local_1f0.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar1;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_1f0.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_1f0.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_1f0.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_1f0.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1f0.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_398.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_1f0.exception.ptr.field_1 + 0x68),0x105);
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_1f0.exception.ptr.field_1.value.details.builder.ptr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_1f0.exception.ptr.field_1.value.details.builder.pos;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_1f0.exception.ptr.field_1.value.details.builder.endPtr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_1f0.exception.ptr.field_1.value.details.builder.disposer;
    local_1f0.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1f0.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1f0.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_398.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_398)
    ;
    aVar2 = local_398.value.ptr.field_1;
    if ((local_398.value.ptr.isSet == true) &&
       (local_398.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
      local_398.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar2);
    }
  }
  else {
    if (local_58 != '\x01') goto LAB_002dbee1;
    Maybe<capnp::MessageReaderAndFds>::Maybe(&local_3c0,&local_50);
    if (local_3c0.ptr.isSet == true) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
                ((Fault *)&local_3c8.value,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++"
                 ,0x45,FAILED,(char *)0x0,
                 "\"Should have gotten kj::none after websocket was closed\"",
                 (char (*) [55])"Should have gotten kj::none after websocket was closed");
      Debug::Fault::fatal((Fault *)&local_3c8.value);
    }
    readyNow();
    uVar1 = local_3c0.ptr.field_1.value.reader.ptr;
    if ((local_3c0.ptr.isSet == true) &&
       (local_3c0.ptr.field_1.value.reader.ptr != (MessageReader *)0x0)) {
      local_3c0.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
      (**(local_3c0.ptr.field_1.value.reader.disposer)->_vptr_Disposer)
                (local_3c0.ptr.field_1.value.reader.disposer,
                 (code *)((long)((MessageReader *)uVar1)->arenaSpace +
                         (long)(((MessageReader *)uVar1)->_vptr_MessageReader[-2] + -0x18)));
    }
    local_398.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_398.value.ptr.isSet = true;
    local_398.value.ptr.field_1 = local_3c8;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_398)
    ;
    aVar2 = local_398.value.ptr.field_1;
    if ((local_398.value.ptr.isSet == true) &&
       (local_398.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
      local_398.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar2);
    }
  }
  if (local_398.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_398.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_002dbee1:
  uVar1 = local_50.ptr.field_1.value.reader.ptr;
  if (((local_58 == '\x01') && (local_50.ptr.isSet == true)) &&
     (local_50.ptr.field_1.value.reader.ptr != (MessageReader *)0x0)) {
    local_50.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
    (**(local_50.ptr.field_1.value.reader.disposer)->_vptr_Disposer)
              (local_50.ptr.field_1.value.reader.disposer,
               (code *)((long)((MessageReader *)uVar1)->arenaSpace +
                       (long)(((MessageReader *)uVar1)->_vptr_MessageReader[-2] + -0x18)));
  }
  if (local_1f0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1f0.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }